

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberAccess.h
# Opt level: O2

ptr<Value> __thiscall MemberAccess::evaluate(MemberAccess *this,Environment *env)

{
  ThrowPacket *pTVar1;
  Identifier *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar2;
  allocator<char> local_a9;
  ptr<Value> currValue;
  ptr<Symbol> symbolRight;
  ptr<Object> object;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  ptr<Symbol> symbolLeft;
  
  std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)&symbolLeft);
  std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)&symbolRight);
  if ((symbolLeft.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     (symbolRight.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    pVar2 = Environment::getValue((Environment *)&currValue,in_RDX);
    (*((currValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
      _vptr_Member[6])(&object,currValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,
                       pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       ._M_pi);
    Object::getAttribute
              ((Object *)this,
               (Identifier *)object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((this->super_BinaryOperator).super_Expression._vptr_Expression != (_func_int **)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&currValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&symbolRight.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&symbolLeft.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
    }
    pTVar1 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_78 + 0x10),"Member not defined",&local_a9);
    ExceptionObjects::undefined((string *)local_78);
    ThrowPacket::ThrowPacket(pTVar1,(ptr<Value> *)local_78);
    __cxa_throw(pTVar1,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  pTVar1 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_78 + 0x10),"The identifier is not a symbol",
             (allocator<char> *)&currValue);
  ExceptionObjects::undefined((string *)local_48);
  ThrowPacket::ThrowPacket(pTVar1,(ptr<Value> *)local_48);
  __cxa_throw(pTVar1,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Symbol> symbolLeft = std::dynamic_pointer_cast<Symbol>(leftExpression);
        ptr<Symbol> symbolRight = std::dynamic_pointer_cast<Symbol>(rightExpression);

        if(!symbolLeft || !symbolRight)
            throw ThrowPacket(ExceptionObjects::undefined("The identifier is not a symbol"));

        ptr<Value> currValue = env -> getValue(symbolLeft -> name);
        ptr<Object> object = currValue -> asObject();
        ptr<Value> value = object -> getAttribute(symbolRight -> name);

        if(!value)
            throw ThrowPacket(ExceptionObjects::undefined("Member not defined"));

        return value;
    }